

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O0

void sse_sum_wd8_avx2(int16_t *data,int stride,int bh,int *x_sum,int64_t *x2_sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i regx2_sum_00;
  __m256i regx_sum_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int j;
  __m256i one;
  int16_t *data_tmp;
  __m256i row_sse_buffer;
  __m256i row_sum_buffer;
  __m256i temp_buffer2;
  __m256i temp_buffer1;
  __m256i sse_buffer;
  __m256i sum_buffer;
  __m256i load_pixels;
  __m256i regx2_sum;
  __m256i regx_sum;
  __m128i load_next_128bit;
  __m128i load_128bit;
  int local_524;
  undefined1 (*local_4e8) [16];
  int64_t *in_stack_fffffffffffffb28;
  int *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  longlong in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_410;
  undefined8 uStack_408;
  ulong uStack_2f8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar6 = vpinsrw_avx(auVar6,1,2);
  auVar6 = vpinsrw_avx(auVar6,1,3);
  auVar6 = vpinsrw_avx(auVar6,1,4);
  auVar6 = vpinsrw_avx(auVar6,1,5);
  auVar6 = vpinsrw_avx(auVar6,1,6);
  auVar6 = vpinsrw_avx(auVar6,1,7);
  uStack_70 = auVar6._0_8_;
  uStack_68 = auVar6._8_8_;
  uStack_2f8 = SUB328(ZEXT832(0),4);
  local_440 = ZEXT832(uStack_2f8) << 0x40;
  local_460 = ZEXT832(uStack_2f8) << 0x40;
  local_4e8 = in_RDI;
  for (local_524 = 0; local_524 < in_EDX >> 1; local_524 = local_524 + 1) {
    auVar6 = ZEXT116(0) * *(undefined1 (*) [16])(*local_4e8 + (long)in_ESI * 2) +
             ZEXT116(1) * *local_4e8;
    auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_4e8 + (long)in_ESI * 2);
    uStack_410 = auVar7._0_8_;
    uStack_408 = auVar7._8_8_;
    auVar5._16_8_ = uStack_410;
    auVar5._0_16_ = auVar6;
    auVar5._24_8_ = uStack_408;
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar1;
    auVar2._24_8_ = uStack_68;
    auVar2 = vpmaddwd_avx2(auVar5,auVar2);
    in_stack_fffffffffffffb40 = auVar2._0_8_;
    in_stack_fffffffffffffb48 = auVar2._8_8_;
    in_stack_fffffffffffffb50 = auVar2._16_8_;
    in_stack_fffffffffffffb58 = auVar2._24_8_;
    auVar4._16_8_ = uStack_410;
    auVar4._0_16_ = auVar6;
    auVar4._24_8_ = uStack_408;
    auVar3._16_8_ = uStack_410;
    auVar3._0_16_ = auVar6;
    auVar3._24_8_ = uStack_408;
    auVar3 = vpmaddwd_avx2(auVar4,auVar3);
    in_stack_fffffffffffffb28 = auVar3._8_8_;
    in_stack_fffffffffffffb30 = auVar3._16_8_;
    in_stack_fffffffffffffb38 = auVar3._24_8_;
    local_440 = vpaddd_avx2(auVar2,local_440);
    local_460 = vpaddd_avx2(auVar3,local_460);
    local_4e8 = (undefined1 (*) [16])(*local_4e8 + (long)(in_ESI << 1) * 2);
  }
  auVar2 = vpunpckldq_avx2(local_460,ZEXT1632(ZEXT816(0)));
  auVar3 = vpunpckhdq_avx2(local_460,ZEXT1632(ZEXT816(0)));
  auVar2 = vpaddq_avx2(auVar2,auVar3);
  vpaddd_avx2(local_440,ZEXT1632(ZEXT816(0)));
  vpaddq_avx2(auVar2,ZEXT1632(ZEXT816(0)));
  regx_sum_00[1] = auVar3._0_8_;
  regx_sum_00[0] = in_stack_fffffffffffffb58;
  regx_sum_00[2] = auVar3._8_8_;
  regx_sum_00[3] = auVar3._16_8_;
  regx2_sum_00[1] = in_stack_fffffffffffffb40;
  regx2_sum_00[0] = in_stack_fffffffffffffb38;
  regx2_sum_00[2] = in_stack_fffffffffffffb48;
  regx2_sum_00[3] = in_stack_fffffffffffffb50;
  accumulate_sse_sum(regx_sum_00,regx2_sum_00,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  return;
}

Assistant:

static inline void sse_sum_wd8_avx2(const int16_t *data, int stride, int bh,
                                    int *x_sum, int64_t *x2_sum) {
  __m128i load_128bit, load_next_128bit;
  __m256i regx_sum, regx2_sum, load_pixels, sum_buffer, sse_buffer,
      temp_buffer1, temp_buffer2, row_sum_buffer, row_sse_buffer;
  const int16_t *data_tmp = data;
  __m256i one = _mm256_set1_epi16(1);
  regx_sum = _mm256_setzero_si256();
  regx2_sum = regx_sum;
  sum_buffer = _mm256_setzero_si256();
  sse_buffer = sum_buffer;

  for (int j = 0; j < (bh >> 1); ++j) {
    // Load 2 rows at a time.
    load_128bit = _mm_loadu_si128((__m128i const *)(data_tmp));
    load_next_128bit = _mm_loadu_si128((__m128i const *)(data_tmp + stride));
    load_pixels = _mm256_insertf128_si256(_mm256_castsi128_si256(load_128bit),
                                          load_next_128bit, 1);

    row_sum_buffer = _mm256_madd_epi16(load_pixels, one);
    row_sse_buffer = _mm256_madd_epi16(load_pixels, load_pixels);
    sum_buffer = _mm256_add_epi32(row_sum_buffer, sum_buffer);
    sse_buffer = _mm256_add_epi32(row_sse_buffer, sse_buffer);
    data_tmp += 2 * stride;
  }

  temp_buffer1 = _mm256_unpacklo_epi32(sse_buffer, _mm256_setzero_si256());
  temp_buffer2 = _mm256_unpackhi_epi32(sse_buffer, _mm256_setzero_si256());
  sse_buffer = _mm256_add_epi64(temp_buffer1, temp_buffer2);
  regx_sum = _mm256_add_epi32(sum_buffer, regx_sum);
  regx2_sum = _mm256_add_epi64(sse_buffer, regx2_sum);

  accumulate_sse_sum(regx_sum, regx2_sum, x_sum, x2_sum);
}